

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

void nifti_swap_16bytes(size_t n,void *ar)

{
  undefined1 uVar1;
  size_t ii;
  undefined1 *puVar2;
  undefined1 *puVar3;
  
  for (ii = 0; ii != n; ii = ii + 1) {
    puVar2 = (undefined1 *)((long)ar + 0xf);
    for (puVar3 = (undefined1 *)ar; puVar3 < puVar2; puVar3 = puVar3 + 1) {
      uVar1 = *puVar3;
      *puVar3 = *puVar2;
      *puVar2 = uVar1;
      puVar2 = puVar2 + -1;
    }
    ar = (void *)((long)ar + 0x10);
  }
  return;
}

Assistant:

void nifti_swap_16bytes( size_t n , void *ar )    /* 16 bytes at a time */
{
   register size_t ii ;
   unsigned char * cp0 = (unsigned char *)ar, * cp1, * cp2 ;
   register unsigned char tval ;

   for( ii=0 ; ii < n ; ii++ ){
       cp1 = cp0;  cp2 = cp0+15;
       while ( cp2 > cp1 )
       {
           tval = *cp1 ; *cp1 = *cp2 ; *cp2 = tval ;
           cp1++; cp2--;
       }
       cp0 += 16;
   }
   return ;
}